

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O1

void __thiscall
UnifiedRegex::SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::
SyncToLiteralAndConsumeInstT
          (SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,InstTag tag,
          CharCount offset,CharCount length)

{
  (this->super_Inst).tag = tag;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.offset = offset;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.length = length;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.isInMap.data[0].
  word = 0;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.isInMap.data[1].
  word = 0;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.isInMap.data[2].
  word = 0;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.isInMap.data[3].
  word = 0;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.defv = -1;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.root = (Type)0x0;
  memset((this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.lastOccurrence.directMap,
         0xff,0x400);
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.goodSuffix.ptr = (int *)0x0;
  return;
}

Assistant:

SyncToLiteralAndConsumeInstT(InstTag tag, CharCount offset, CharCount length) : Inst(tag), ScannerT(offset, length) {}